

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::time_internal::cctz::(anonymous_namespace)::AndroidZoneInfoSource::
Version_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 0x20),
             *(long *)((long)this + 0x28) + *(long *)((long)this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string Version() const override { return version_; }